

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

optional_idx __thiscall duckdb::StandardBufferManager::GetMaxSwap(StandardBufferManager *this)

{
  mutex *__mutex;
  int iVar1;
  idx_t in_RAX;
  pointer pTVar2;
  type pTVar3;
  optional_idx local_18;
  
  __mutex = &(this->temporary_directory).lock;
  local_18.index = in_RAX;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if ((this->temporary_directory).handle.
        super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl ==
        (TemporaryDirectoryHandle *)0x0) {
      local_18.index = 0xffffffffffffffff;
    }
    else {
      pTVar2 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
               ::operator->(&(this->temporary_directory).handle);
      pTVar3 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
               ::operator*(&pTVar2->temp_file);
      optional_idx::optional_idx(&local_18,pTVar3->max_swap_space);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (optional_idx)local_18.index;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

optional_idx StandardBufferManager::GetMaxSwap() const {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (!temporary_directory.handle) {
		return optional_idx();
	}
	return temporary_directory.handle->GetTempFile().GetMaxSwapSpace();
}